

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::MergePartialFromCodedStream
          (TreeEnsembleParameters_TreeNode *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  double *pdVar4;
  bool bVar5;
  int byte_limit;
  uint32 uVar6;
  double in_RAX;
  Type *this_00;
  uint8 *puVar7;
  unsigned_long uVar8;
  pair<int,_int> pVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  double dVar13;
  pair<unsigned_long,_bool> pVar14;
  double local_38;
  
  local_38 = in_RAX;
LAB_003be1fa:
  pbVar3 = input->buffer_;
  uVar6 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar12 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar11 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar6 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar11, (~(uint)*pbVar1 & uVar11) < 0x80))
      goto LAB_003be53f;
      uVar12 = (ulong)((uVar11 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar12 = uVar12 | 0x100000000;
  }
  else {
LAB_003be53f:
    uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
    uVar12 = 0;
    if (uVar6 - 1 < 0x3fff) {
      uVar12 = 0x100000000;
    }
    uVar12 = uVar6 | uVar12;
  }
  uVar6 = (uint32)uVar12;
  if ((uVar12 & 0x100000000) == 0) goto switchD_003be298_caseD_4;
  uVar11 = (uint)(uVar12 >> 3) & 0x1fffffff;
  cVar10 = (char)uVar12;
  switch(uVar11) {
  case 1:
    if (cVar10 != '\b') break;
    puVar7 = input->buffer_;
    if ((puVar7 < input->buffer_end_) && (-1 < (long)(char)*puVar7)) {
      this->treeid_ = (long)(char)*puVar7;
      goto LAB_003be436;
    }
    pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
    this->treeid_ = pVar14.first;
LAB_003be517:
    if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return false;
    }
    goto LAB_003be1fa;
  case 2:
    if (cVar10 == '\x10') {
      puVar7 = input->buffer_;
      if ((input->buffer_end_ <= puVar7) || ((long)(char)*puVar7 < 0)) {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->nodeid_ = pVar14.first;
        goto LAB_003be517;
      }
      this->nodeid_ = (long)(char)*puVar7;
LAB_003be436:
      input->buffer_ = puVar7 + 1;
      goto LAB_003be1fa;
    }
    break;
  case 3:
    if (cVar10 == '\x18') {
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar2 = *pbVar3;
        uVar12 = (ulong)bVar2;
        uVar6 = (uint32)bVar2;
        if ((char)bVar2 < '\0') goto LAB_003be57e;
        input->buffer_ = pbVar3 + 1;
      }
      else {
        uVar6 = 0;
LAB_003be57e:
        uVar12 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        if ((long)uVar12 < 0) {
          return false;
        }
      }
      this->nodebehavior_ = (int)uVar12;
      goto LAB_003be1fa;
    }
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    break;
  case 10:
    if (cVar10 == 'P') {
      puVar7 = input->buffer_;
      if ((input->buffer_end_ <= puVar7) || ((long)(char)*puVar7 < 0)) {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->branchfeatureindex_ = pVar14.first;
        goto LAB_003be517;
      }
      this->branchfeatureindex_ = (long)(char)*puVar7;
      goto LAB_003be436;
    }
    break;
  case 0xb:
    if (cVar10 == 'Y') {
      pdVar4 = (double *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
        bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                          (input,(uint64 *)&local_38);
        dVar13 = local_38;
        if (!bVar5) {
          return false;
        }
      }
      else {
        dVar13 = *pdVar4;
        input->buffer_ = (uint8 *)(pdVar4 + 1);
      }
      this->branchfeaturevalue_ = dVar13;
      goto LAB_003be1fa;
    }
    break;
  case 0xc:
    if (cVar10 == '`') {
      puVar7 = input->buffer_;
      if ((input->buffer_end_ <= puVar7) || ((long)(char)*puVar7 < 0)) {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->truechildnodeid_ = pVar14.first;
        goto LAB_003be517;
      }
      this->truechildnodeid_ = (long)(char)*puVar7;
      goto LAB_003be436;
    }
    break;
  case 0xd:
    if (cVar10 == 'h') {
      puVar7 = input->buffer_;
      if ((input->buffer_end_ <= puVar7) || ((long)(char)*puVar7 < 0)) {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->falsechildnodeid_ = pVar14.first;
        goto LAB_003be517;
      }
      this->falsechildnodeid_ = (long)(char)*puVar7;
      goto LAB_003be436;
    }
    break;
  case 0xe:
    if (cVar10 == 'p') {
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (uVar8 = (unsigned_long)(char)*puVar7, -1 < (long)uVar8))
      {
        input->buffer_ = puVar7 + 1;
      }
      else {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar8 = pVar14.first;
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->missingvaluetrackstruechild_ = uVar8 != 0;
      goto LAB_003be1fa;
    }
    break;
  case 0x14:
    if (cVar10 != -0x5e) break;
    this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::TypeHandler>
                        (&(this->evaluationinfo_).super_RepeatedPtrFieldBase,(Type *)0x0);
    puVar7 = input->buffer_;
    if ((puVar7 < input->buffer_end_) && (byte_limit = (int)(char)*puVar7, -1 < byte_limit)) {
      input->buffer_ = puVar7 + 1;
    }
    else {
      byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (byte_limit < 0) {
        return false;
      }
    }
    pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                      (input,byte_limit);
    if ((long)pVar9 < 0) {
      return false;
    }
    bVar5 = TreeEnsembleParameters_TreeNode_EvaluationInfo::MergePartialFromCodedStream
                      (this_00,input);
    if (!bVar5) {
      return false;
    }
    bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                      (input,pVar9.first);
    goto joined_r0x003be4c8;
  default:
    if ((uVar11 == 0x1e) && (cVar10 == -0xf)) {
      pdVar4 = (double *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
        bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                          (input,(uint64 *)&local_38);
        dVar13 = local_38;
        if (!bVar5) {
          return false;
        }
      }
      else {
        dVar13 = *pdVar4;
        input->buffer_ = (uint8 *)(pdVar4 + 1);
      }
      this->relativehitrate_ = dVar13;
      goto LAB_003be1fa;
    }
  }
switchD_003be298_caseD_4:
  if (uVar6 == 0) {
    return true;
  }
  if ((uVar6 & 7) == 4) {
    return true;
  }
  bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
joined_r0x003be4c8:
  if (!bVar5) {
    return false;
  }
  goto LAB_003be1fa;
}

Assistant:

bool TreeEnsembleParameters_TreeNode::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 treeId = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &treeid_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 nodeId = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &nodeid_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_nodebehavior(static_cast< ::CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 branchFeatureIndex = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &branchfeatureindex_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double branchFeatureValue = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(89u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &branchfeaturevalue_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 trueChildNodeId = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &truechildnodeid_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 falseChildNodeId = 13;
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(104u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &falsechildnodeid_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool missingValueTracksTrueChild = 14;
      case 14: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(112u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &missingvaluetrackstruechild_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_evaluationinfo()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double relativeHitRate = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(241u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &relativehitrate_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  return false;
#undef DO_
}